

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

CBData * __thiscall asmjit::CodeBuilder::newDataNode(CodeBuilder *this,void *data,uint32_t size)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  CBData *pCVar3;
  CodeBuilder *__dest;
  CodeBuilder *this_00;
  size_t unaff_R13;
  CodeBuilder *__src;
  size_t local_30;
  
  this_00 = this;
  if (size < 0x15) goto LAB_00162f26;
  this_00 = (CodeBuilder *)&this->_cbDataZone;
  unaff_R13 = (size_t)size;
  __dest = (CodeBuilder *)(this->_cbDataZone)._ptr;
  puVar2 = (this->_cbDataZone)._end;
  if ((ulong)((long)puVar2 - (long)__dest) < unaff_R13) goto LAB_00162fbe;
  puVar1 = (uint8_t *)((long)&(__dest->super_CodeEmitter)._vptr_CodeEmitter + unaff_R13);
  ((Zone *)this_00)->_ptr = puVar1;
  __src = (CodeBuilder *)data;
  if (puVar1 <= puVar2) {
    while( true ) {
      data = __src;
      if ((__dest != (CodeBuilder *)0x0) && (data = __dest, __src != (CodeBuilder *)0x0)) {
        this_00 = __dest;
        memcpy(__dest,__src,unaff_R13);
      }
      if (__dest == (CodeBuilder *)0x0) break;
LAB_00162f26:
      if ((this->_cbHeap)._zone != (Zone *)0x0) {
        pCVar3 = (CBData *)ZoneHeap::_alloc(&this->_cbHeap,0x40,&local_30);
        (pCVar3->super_CBNode)._prev = (CBNode *)0x0;
        (pCVar3->super_CBNode)._next = (CBNode *)0x0;
        (pCVar3->super_CBNode)._type = '\x02';
        (pCVar3->super_CBNode)._opCount = '\0';
        (pCVar3->super_CBNode)._flags = (uint16_t)this->_nodeFlags;
        (pCVar3->super_CBNode)._position = this->_position;
        (pCVar3->super_CBNode)._inlineComment = (char *)0x0;
        (pCVar3->super_CBNode)._passData = (void *)0x0;
        if (size < 0x15) {
          if ((CodeBuilder *)data != (CodeBuilder *)0x0) {
            memcpy(&pCVar3->field_0,data,(ulong)size);
          }
        }
        else {
          *(void **)&pCVar3->field_0 = data;
        }
        (pCVar3->field_0).field_0._size = size;
        return pCVar3;
      }
      newDataNode();
LAB_00162fbe:
      __dest = (CodeBuilder *)Zone::_alloc((Zone *)this_00,unaff_R13);
      __src = (CodeBuilder *)data;
    }
    return (CBData *)0x0;
  }
  newDataNode();
}

Assistant:

CBData* CodeBuilder::newDataNode(const void* data, uint32_t size) noexcept {
  if (size > CBData::kInlineBufferSize) {
    void* cloned = _cbDataZone.alloc(size);
    if (!cloned) return nullptr;

    if (data) ::memcpy(cloned, data, size);
    data = cloned;
  }

  return newNodeT<CBData>(const_cast<void*>(data), size);
}